

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O1

ICHUllError __thiscall HACD::ICHUll::DoubleTriangle(ICHUll *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  CircularListElement<HACD::TMMVertex> *v2;
  undefined1 auVar9 [16];
  bool bVar10;
  CircularListElement<HACD::TMMTriangle> *fold;
  CircularListElement<HACD::TMMVertex> *pCVar11;
  CircularListElement<HACD::TMMVertex> *v0;
  CircularListElement<HACD::TMMVertex> *pCVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM21 [16];
  TMMVertex temp;
  TMMVertex local_60;
  
  this->m_isFlat = false;
  pCVar11 = (this->m_mesh).m_vertices.m_head;
  v0 = pCVar11;
  while( true ) {
    pCVar12 = v0->m_next;
    v2 = pCVar12->m_next;
    dVar19 = (v0->m_data).m_pos.m_data[1];
    dVar1 = (v0->m_data).m_pos.m_data[2];
    dVar39 = (v2->m_data).m_pos.m_data[2] - dVar1;
    dVar41 = (pCVar12->m_data).m_pos.m_data[1] - dVar19;
    dVar1 = (pCVar12->m_data).m_pos.m_data[2] - dVar1;
    dVar19 = (v2->m_data).m_pos.m_data[1] - dVar19;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar41;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar39;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar19 * dVar1;
    auVar13 = vfmsub231sd_fma(auVar15,auVar14,auVar13);
    if ((auVar13._0_8_ != 0.0) || (NAN(auVar13._0_8_))) break;
    dVar2 = (v0->m_data).m_pos.m_data[0];
    dVar44 = (v2->m_data).m_pos.m_data[0] - dVar2;
    dVar2 = (pCVar12->m_data).m_pos.m_data[0] - dVar2;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar39 * dVar2;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar44;
    auVar13 = vfmsub213sd_fma(auVar17,auVar18,auVar16);
    if ((auVar13._0_8_ != 0.0) || (NAN(auVar13._0_8_))) break;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar19;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar44 * dVar41;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar2;
    auVar13 = vfmsub213sd_fma(auVar22,auVar35,auVar24);
    if ((auVar13._0_8_ != 0.0) || (NAN(auVar13._0_8_))) break;
    v0 = pCVar12;
    if (pCVar12 == pCVar11) {
      return ICHUllErrorCoplanarPoints;
    }
  }
  (v2->m_data).m_tag = true;
  (pCVar12->m_data).m_tag = true;
  (v0->m_data).m_tag = true;
  fold = MakeFace(this,v0,pCVar12,v2,(CircularListElement<HACD::TMMTriangle> *)0x0);
  MakeFace(this,v2,pCVar12,v0,fold);
  pCVar11 = v2->m_next;
  (this->m_mesh).m_vertices.m_head = pCVar11;
  dVar19 = (v0->m_data).m_pos.m_data[0];
  dVar1 = (v0->m_data).m_pos.m_data[1];
  dVar39 = (pCVar11->m_data).m_pos.m_data[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar39;
  dVar41 = (pCVar11->m_data).m_pos.m_data[1];
  dVar2 = (v0->m_data).m_pos.m_data[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  dVar44 = (pCVar11->m_data).m_pos.m_data[2];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar44;
  dVar3 = (pCVar12->m_data).m_pos.m_data[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3;
  dVar4 = (pCVar12->m_data).m_pos.m_data[1];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar4;
  dVar5 = (pCVar12->m_data).m_pos.m_data[2];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar5;
  auVar13 = vsubsd_avx512f(auVar33,auVar49);
  dVar6 = (v2->m_data).m_pos.m_data[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar6;
  dVar7 = (v2->m_data).m_pos.m_data[1];
  auVar14 = vsubsd_avx512f(auVar36,auVar38);
  dVar8 = (v2->m_data).m_pos.m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar7 - dVar41;
  auVar15 = vmulsd_avx512f(auVar40,auVar13);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar8 - dVar44;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar4 - dVar41;
  auVar15 = vfmsub231sd_avx512f(auVar15,auVar58,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = (dVar8 - dVar44) * (dVar3 - dVar39);
  auVar13 = vfmsub231sd_avx512f(auVar51,auVar14,auVar13);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar19 - dVar39;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = (dVar1 - dVar41) * auVar13._0_8_;
  auVar15 = vfmadd231sd_avx512f(auVar45,auVar42,auVar15);
  auVar13 = vmulsd_avx512f(auVar14,auVar58);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar3 - dVar39;
  auVar13 = vfmsub231sd_fma(auVar13,auVar56,auVar40);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar2 - dVar44;
  auVar13 = vfmadd213sd_fma(auVar13,auVar54,auVar15);
  auVar9._8_8_ = 0x7fffffffffffffff;
  auVar9._0_8_ = 0x7fffffffffffffff;
  auVar13 = vandpd_avx512vl(auVar13,auVar9);
  pCVar12 = pCVar11;
  if (auVar13._0_8_ < 1e-09) {
    auVar43._8_8_ = 0x7fffffffffffffff;
    auVar43._0_8_ = 0x7fffffffffffffff;
    do {
      pCVar12 = pCVar12->m_next;
      if ((pCVar12->m_data).m_tag == true) {
        dVar39 = 0.0;
        dVar41 = 0.0;
        dVar44 = 0.0;
        pCVar11 = v0;
        do {
          dVar39 = dVar39 + (pCVar11->m_data).m_pos.m_data[0];
          dVar41 = dVar41 + (pCVar11->m_data).m_pos.m_data[1];
          dVar44 = dVar44 + (pCVar11->m_data).m_pos.m_data[2];
          pCVar11 = pCVar11->m_next;
        } while (pCVar11 != v0);
        auVar13 = vcvtusi2sd_avx512f(in_XMM21,(this->m_mesh).m_vertices.m_size);
        dVar48 = auVar13._0_8_;
        dVar5 = dVar5 - dVar2;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar8 - dVar2;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar4 - dVar1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = (dVar7 - dVar1) * dVar5;
        auVar13 = vfmsub231sd_fma(auVar37,auVar31,auVar26);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar6 - dVar19;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (dVar8 - dVar2) * (dVar3 - dVar19);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar5;
        auVar14 = vfmsub231sd_fma(auVar27,auVar20,auVar34);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar7 - dVar1;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar3 - dVar19;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = (dVar6 - dVar19) * (dVar4 - dVar1);
        auVar15 = vfmsub231sd_fma(auVar32,auVar29,auVar23);
        (this->m_normal).m_data[0] = auVar13._0_8_;
        dVar19 = auVar14._0_8_;
        (this->m_normal).m_data[1] = dVar19;
        (this->m_normal).m_data[2] = auVar15._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar19 * dVar19;
        auVar13 = vfmadd231sd_fma(auVar21,auVar13,auVar13);
        auVar13 = vfmadd231sd_fma(auVar13,auVar15,auVar15);
        if (auVar13._0_8_ < 0.0) {
          dVar19 = sqrt(auVar13._0_8_);
        }
        else {
          auVar13 = vsqrtsd_avx(auVar13,auVar13);
          dVar19 = auVar13._0_8_;
        }
        if ((dVar19 != 0.0) || (NAN(dVar19))) {
          dVar1 = (this->m_normal).m_data[1];
          (this->m_normal).m_data[0] = (this->m_normal).m_data[0] / dVar19;
          (this->m_normal).m_data[1] = dVar1 / dVar19;
          (this->m_normal).m_data[2] = (this->m_normal).m_data[2] / dVar19;
        }
        (this->m_mesh).m_vertices.m_head = v2;
        local_60.m_pos.m_data[0] = dVar39 / dVar48 + (this->m_normal).m_data[0];
        local_60.m_pos.m_data[1] = dVar41 / dVar48 + (this->m_normal).m_data[1];
        local_60.m_pos.m_data[2] = dVar44 / dVar48 + (this->m_normal).m_data[2];
        bVar10 = AddPoints(this,&local_60.m_pos,1);
        if (bVar10) {
          (((this->m_mesh).m_vertices.m_head)->m_data).m_name = 0x7fffffffffffffff;
        }
        this->m_isFlat = true;
        return ICHUllErrorOK;
      }
      dVar39 = (pCVar12->m_data).m_pos.m_data[0];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar39;
      dVar41 = (pCVar12->m_data).m_pos.m_data[1];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = dVar41;
      dVar44 = (pCVar12->m_data).m_pos.m_data[2];
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar44;
      auVar13 = vsubsd_avx512f(auVar25,auVar59);
      auVar14 = vsubsd_avx512f(auVar28,auVar46);
      auVar15 = vsubsd_avx512f(auVar30,auVar52);
      auVar16 = vsubsd_avx512f(auVar33,auVar59);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar7 - dVar41;
      auVar17 = vmulsd_avx512f(auVar53,auVar16);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar8 - dVar44;
      auVar17 = vfmsub231sd_avx512f(auVar17,auVar15,auVar60);
      auVar18 = vmulsd_avx512f(auVar60,auVar14);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar6 - dVar39;
      auVar16 = vfmsub231sd_avx512f(auVar18,auVar47,auVar16);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = dVar19 - dVar39;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (dVar1 - dVar41) * auVar16._0_8_;
      auVar16 = vfmadd231sd_avx512f(auVar57,auVar55,auVar17);
      auVar15 = vmulsd_avx512f(auVar47,auVar15);
      auVar14 = vfmsub231sd_avx512f(auVar15,auVar14,auVar53);
      auVar13 = vfmadd213sd_avx512f(auVar14,auVar13,auVar16);
      auVar13 = vandpd_avx(auVar13,auVar43);
    } while (auVar13._0_8_ < 1e-09);
  }
  if (pCVar12 != pCVar11) {
    TMMVertex::TMMVertex(&local_60);
    local_60.m_name = (pCVar12->m_data).m_name;
    local_60.m_pos.m_data[0] = (pCVar12->m_data).m_pos.m_data[0];
    local_60.m_pos.m_data[1] = (pCVar12->m_data).m_pos.m_data[1];
    local_60.m_pos.m_data[2] = (pCVar12->m_data).m_pos.m_data[2];
    pCVar11 = (this->m_mesh).m_vertices.m_head;
    (pCVar12->m_data).m_name = (pCVar11->m_data).m_name;
    (pCVar12->m_data).m_pos.m_data[0] = (pCVar11->m_data).m_pos.m_data[0];
    (pCVar12->m_data).m_pos.m_data[1] = (pCVar11->m_data).m_pos.m_data[1];
    (pCVar12->m_data).m_pos.m_data[2] = (pCVar11->m_data).m_pos.m_data[2];
    (pCVar11->m_data).m_name = local_60.m_name;
    (pCVar11->m_data).m_pos.m_data[0] = local_60.m_pos.m_data[0];
    (pCVar11->m_data).m_pos.m_data[1] = local_60.m_pos.m_data[1];
    (pCVar11->m_data).m_pos.m_data[2] = local_60.m_pos.m_data[2];
    TMMVertex::~TMMVertex(&local_60);
  }
  return ICHUllErrorOK;
}

Assistant:

ICHUllError ICHUll::DoubleTriangle()
	{
        // find three non colinear points
		m_isFlat = false;
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * v0 = vertices.GetHead();
        while( Colinear(v0->GetData().m_pos, 
                        v0->GetNext()->GetData().m_pos, 
                        v0->GetNext()->GetNext()->GetData().m_pos))
        {
            if ( (v0 = v0->GetNext()) == vertices.GetHead())
            {
                return ICHUllErrorCoplanarPoints;
            }
        }
        CircularListElement<TMMVertex> * v1 = v0->GetNext();
        CircularListElement<TMMVertex> * v2 = v1->GetNext();
        // mark points as processed
        v0->GetData().m_tag = v1->GetData().m_tag = v2->GetData().m_tag = true;
        
        // create two triangles
        CircularListElement<TMMTriangle> * f0 = MakeFace(v0, v1, v2, 0);
        MakeFace(v2, v1, v0, f0);

        // find a fourth non-coplanar point to form tetrahedron
        CircularListElement<TMMVertex> * v3 = v2->GetNext();
        vertices.GetHead() = v3;

		double vol = Volume(v0->GetData().m_pos, v1->GetData().m_pos, v2->GetData().m_pos, v3->GetData().m_pos);
		while (fabs(vol) < sc_eps && !v3->GetNext()->GetData().m_tag)
		{
			v3 = v3->GetNext();
			vol = Volume(v0->GetData().m_pos, v1->GetData().m_pos, v2->GetData().m_pos, v3->GetData().m_pos);
		}			
		if (fabs(vol) < sc_eps)
		{
			// compute the barycenter
			Vec3<Real> bary(0.0,0.0,0.0);
			CircularListElement<TMMVertex> * vBary = v0;
			do
			{
				bary += vBary->GetData().m_pos;
			}
			while ( (vBary = vBary->GetNext()) != v0);
			bary /= static_cast<Real>(vertices.GetSize());

			// Compute the normal to the plane
            Vec3<Real> p0 = v0->GetData().m_pos;
            Vec3<Real> p1 = v1->GetData().m_pos;            
            Vec3<Real> p2 = v2->GetData().m_pos;			
            m_normal = (p1-p0) ^ (p2-p0);
            m_normal.Normalize();
			// add dummy vertex placed at (bary + normal)
			vertices.GetHead() = v2;
			Vec3<Real> newPt = bary + m_normal;
			AddPoint(newPt, sc_dummyIndex); 
			m_isFlat = true;
            v3 = v2->GetNext();
			return ICHUllErrorOK;
		}
		else if (v3 != vertices.GetHead())
		{
			TMMVertex temp;
			temp.m_name = v3->GetData().m_name;
			temp.m_pos = v3->GetData().m_pos;
			v3->GetData().m_name = vertices.GetHead()->GetData().m_name;
			v3->GetData().m_pos = vertices.GetHead()->GetData().m_pos;
			vertices.GetHead()->GetData().m_name = temp.m_name;
			vertices.GetHead()->GetData().m_pos = temp.m_pos;
		}
		return ICHUllErrorOK;
	}